

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::generateProfilingMarker(FederateState *this)

{
  format_args args;
  string_view fmt;
  GlobalFederateId sourceId;
  string *x;
  value<fmt::v11::context> *in_RDI;
  ActionMessage prof;
  string message;
  time_point gtime;
  time_point ctime;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  BrokerBase *in_stack_fffffffffffffd30;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar1;
  GlobalFederateId in_stack_fffffffffffffd50;
  SmallBuffer *in_stack_fffffffffffffd58;
  FederateStates in_stack_fffffffffffffd7f;
  double local_1c0;
  rep local_1b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1b0;
  rep local_1a8;
  rep local_1a0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_198;
  rep local_190;
  GlobalFederateId local_188;
  BaseType local_184;
  char *local_180;
  undefined8 local_178;
  undefined1 local_170 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_150;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_148 [2];
  undefined1 local_138 [11];
  undefined1 in_stack_fffffffffffffed3;
  int in_stack_fffffffffffffed4;
  BaseType BVar2;
  FederateState *in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  rep rVar3;
  char *local_e8 [2];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 local_c0;
  double *local_b8;
  rep *local_b0;
  rep *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  BaseType *local_98;
  char *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined4 in_stack_ffffffffffffff90;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  
  local_148[0].__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_150.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_180 = "<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>";
  local_178 = 0x34;
  local_188 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)((long)&in_RDI[2].field_0 + 0xc),
                         seq_cst);
  local_184 = GlobalFederateId::baseValue(&local_188);
  getState((FederateState *)0x4c4979);
  x = fedStateString_abi_cxx11_(in_stack_fffffffffffffd7f);
  local_1a0 = (rep)std::chrono::
                   time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(local_148);
  local_198.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_190 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_198);
  local_1b8 = (rep)std::chrono::
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(&local_150);
  local_1b0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_1a8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1b0);
  local_1c0 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x4c4a15);
  local_78 = local_170;
  local_88 = local_180;
  local_80 = local_178;
  local_98 = &local_184;
  local_a8 = &local_190;
  local_b0 = &local_1a8;
  local_b8 = &local_1c0;
  local_c8 = local_180;
  local_c0 = local_178;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
  aVar4.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffed8;
  BVar2 = *local_98;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
  rVar3 = *local_a8;
  local_e8[0] = (char *)*local_b8;
  local_d0 = local_138;
  local_d8 = 0xa33d1d;
  fmt.size_ = (size_t)local_e8;
  fmt.data_ = local_e8[0];
  args.desc_._4_4_ = BVar2;
  args.desc_._0_4_ = in_stack_ffffffffffffff90;
  args.field_1.values_ = aVar4.values_;
  ::fmt::v11::vformat_abi_cxx11_(fmt,args);
  if ((undefined1  [16])
      ((undefined1  [16])in_RDI[0x29].field_0.uint128_value & (undefined1  [16])0x100000000000000)
      == (undefined1  [16])0x0) {
    if (in_RDI[0x2a].field_0.string.size != 0) {
      sourceId = std::atomic<helics::GlobalFederateId>::load
                           ((atomic<helics::GlobalFederateId> *)((long)&in_RDI[2].field_0 + 0xc),
                            seq_cst);
      startingAction = (action_t)((ulong)in_RDI >> 0x20);
      uVar1 = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffd50,(GlobalBrokerId)0x0);
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(uVar1,in_stack_fffffffffffffd48),startingAction,sourceId,
                 in_stack_fffffffffffffd50);
      SmallBuffer::operator=
                (in_stack_fffffffffffffd58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(sourceId.gid,in_stack_fffffffffffffd50.gid));
      BrokerBase::addActionMessage
                (in_stack_fffffffffffffd30,
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd30);
    }
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30);
    logMessage(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffed3);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  return;
}

Assistant:

void FederateState::generateProfilingMarker()
{
    auto ctime = std::chrono::steady_clock::now();
    auto gtime = std::chrono::system_clock::now();
    const std::string message = fmt::format(
        "<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>",
        name,
        global_id.load().baseValue(),
        fedStateString(getState()),
        std::chrono::duration_cast<std::chrono::nanoseconds>(ctime.time_since_epoch()).count(),
        std::chrono::duration_cast<std::chrono::nanoseconds>(gtime.time_since_epoch()).count(),
        static_cast<double>(time_granted));

    if (mLocalProfileCapture) {
        logMessage(HELICS_LOG_LEVEL_PROFILING, name, message);
    } else {
        if (mParent != nullptr) {
            ActionMessage prof(CMD_PROFILER_DATA, global_id.load(), parent_broker_id);
            prof.payload = message;
            mParent->addActionMessage(std::move(prof));
        }
    }
}